

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderPerformanceCase.cpp
# Opt level: O1

int __thiscall deqp::gls::ShaderPerformanceCase::init(ShaderPerformanceCase *this,EVP_PKEY_CTX *ctx)

{
  ostringstream *poVar1;
  ostringstream *this_00;
  pointer log;
  RenderContext *renderCtx;
  int extraout_EAX;
  int iVar2;
  ShaderProgram *this_01;
  undefined4 extraout_var;
  long lVar4;
  ProgramSources sources;
  string local_3b0;
  string local_390;
  LogSection local_370;
  undefined1 local_330 [120];
  ios_base local_2b8 [24];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_2a0;
  undefined1 local_280 [208];
  undefined1 local_1b0 [384];
  int *piVar3;
  
  log = (pointer)((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  this_01 = (ShaderProgram *)operator_new(0xd0);
  renderCtx = this->m_renderCtx;
  local_280[0x10] = 0;
  local_280._17_8_ = 0;
  local_280._0_8_ = (pointer)0x0;
  local_280[8] = 0;
  local_280._9_7_ = 0;
  memset((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_330,0,0xac);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_330,&this->m_vertShaderSource);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_330 + 0x18),&this->m_fragShaderSource);
  glu::ShaderProgram::ShaderProgram(this_01,renderCtx,(ProgramSources *)local_330);
  this->m_program = this_01;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_280);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_2a0);
  lVar4 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_330 + lVar4));
    lVar4 = lVar4 + -0x18;
  } while (lVar4 != -0x18);
  if ((this->m_program->m_program).m_info.linkOk == true) {
    iVar2 = (*this->m_renderCtx->_vptr_RenderContext[4])();
    piVar3 = (int *)CONCAT44(extraout_var,iVar2);
    local_390._M_dataplus._M_p = (pointer)&local_390.field_2;
    local_390.field_2._M_allocated_capacity = 0x61547265646e6552;
    local_390.field_2._8_4_ = 0x74656772;
    local_390._M_string_length = 0xc;
    local_390.field_2._M_local_buf[0xc] = '\0';
    local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
    local_3b0.field_2._M_allocated_capacity._0_5_ = 0x65646e6552;
    local_3b0.field_2._M_allocated_capacity._5_3_ = 0x742072;
    local_3b0.field_2._8_5_ = 0x7465677261;
    local_3b0._M_string_length = 0xd;
    local_3b0.field_2._M_local_buf[0xd] = '\0';
    tcu::LogSection::LogSection(&local_370,&local_390,&local_3b0);
    tcu::TestLog::startSection
              ((TestLog *)log,local_370.m_name._M_dataplus._M_p,
               local_370.m_description._M_dataplus._M_p);
    poVar1 = (ostringstream *)(local_1b0 + 8);
    local_1b0._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"size: ",6);
    std::ostream::operator<<(poVar1,*piVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"x",1);
    std::ostream::operator<<(poVar1,piVar3[1]);
    local_330._0_8_ =
         tcu::MessageBuilder::operator<<
                   ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    this_00 = (ostringstream *)(local_330 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"bits:",5);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," R",2);
    std::ostream::operator<<(this_00,piVar3[2]);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," G",2);
    std::ostream::operator<<(this_00,piVar3[3]);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," B",2);
    std::ostream::operator<<(this_00,piVar3[4]);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," A",2);
    std::ostream::operator<<(this_00,piVar3[5]);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," D",2);
    std::ostream::operator<<(this_00,piVar3[6]);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," S",2);
    std::ostream::operator<<(this_00,piVar3[7]);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_330,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base(local_2b8);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_370.m_description._M_dataplus._M_p != &local_370.m_description.field_2) {
      operator_delete(local_370.m_description._M_dataplus._M_p,
                      local_370.m_description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_370.m_name._M_dataplus._M_p != &local_370.m_name.field_2) {
      operator_delete(local_370.m_name._M_dataplus._M_p,
                      local_370.m_name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
      operator_delete(local_3b0._M_dataplus._M_p,
                      CONCAT35(local_3b0.field_2._M_allocated_capacity._5_3_,
                               local_3b0.field_2._M_allocated_capacity._0_5_) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_390._M_dataplus._M_p != &local_390.field_2) {
      operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
    }
    local_330._0_8_ = log;
    if (piVar3[8] == 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_330 + 8));
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_330 + 8),"No MSAA",7);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_330,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    else {
      poVar1 = (ostringstream *)(local_330 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::ostream::operator<<(poVar1,piVar3[8]);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"x MSAA",6);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_330,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_330 + 8));
    std::ios_base::~ios_base(local_2b8);
    tcu::TestLog::endSection((TestLog *)log);
    ShaderPerformanceMeasurer::init
              (&this->m_measurer,(EVP_PKEY_CTX *)(ulong)(this->m_program->m_program).m_program);
    ShaderPerformanceMeasurer::logParameters(&this->m_measurer,(TestLog *)log);
    glu::operator<<((TestLog *)log,this->m_program);
    (*(this->super_TestCase).super_TestNode._vptr_TestNode[5])
              (this,(ulong)(this->m_program->m_program).m_program);
    iVar2 = (*(this->super_TestCase).super_TestNode._vptr_TestNode[6])(this);
  }
  else {
    glu::operator<<((TestLog *)log,this->m_program);
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,"Compile failed")
    ;
    iVar2 = extraout_EAX;
  }
  return iVar2;
}

Assistant:

void ShaderPerformanceCase::init (void)
{
	tcu::TestLog& log = m_testCtx.getLog();

	m_program = new glu::ShaderProgram(m_renderCtx, glu::makeVtxFragSources(m_vertShaderSource, m_fragShaderSource));

	if (m_program->isOk())
	{
		const int initialCallCount = m_initialCalibration ? m_initialCalibration->initialNumCalls : 1;
		logRenderTargetInfo(log, m_renderCtx.getRenderTarget());
		m_measurer.init(m_program->getProgram(), m_attributes, initialCallCount);
		m_measurer.logParameters(log);
		log << *m_program;
	}
	else
	{
		log << *m_program;
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Compile failed");
		return; // Skip rest of init.
	}

	setupProgram(m_program->getProgram());
	setupRenderState();
}